

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O2

void __thiscall jsonnet::internal::anon_unknown_0::Stack::mark(Stack *this,Heap *heap)

{
  pointer pFVar1;
  pointer ppHVar2;
  _Base_ptr p_Var3;
  HeapThunk **th;
  pointer ppHVar4;
  Frame *f;
  pointer pFVar5;
  Value v;
  Value v_00;
  
  pFVar1 = (this->stack).
           super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pFVar5 = (this->stack).
                super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
                ._M_impl.super__Vector_impl_data._M_start; pFVar5 != pFVar1; pFVar5 = pFVar5 + 1) {
    v._4_4_ = 0;
    v.t = (pFVar5->val).t;
    v.v.h = (pFVar5->val).v.h;
    Heap::markFrom(heap,v);
    v_00._4_4_ = 0;
    v_00.t = (pFVar5->val2).t;
    v_00.v.h = (pFVar5->val2).v.h;
    Heap::markFrom(heap,v_00);
    if (pFVar5->context != (HeapEntity *)0x0) {
      Heap::markFrom(heap,pFVar5->context);
    }
    if (&pFVar5->self->super_HeapEntity != (HeapEntity *)0x0) {
      Heap::markFrom(heap,&pFVar5->self->super_HeapEntity);
    }
    for (p_Var3 = (pFVar5->bindings)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var3 != &(pFVar5->bindings)._M_t._M_impl.super__Rb_tree_header;
        p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
      Heap::markFrom(heap,(HeapEntity *)p_Var3[1]._M_parent);
    }
    for (p_Var3 = (pFVar5->elements)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var3 != &(pFVar5->elements)._M_t._M_impl.super__Rb_tree_header;
        p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
      Heap::markFrom(heap,(HeapEntity *)p_Var3[1]._M_parent);
    }
    ppHVar2 = (pFVar5->thunks).
              super__Vector_base<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    for (ppHVar4 = (pFVar5->thunks).
                   super__Vector_base<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
                   ._M_impl.super__Vector_impl_data._M_start; ppHVar4 != ppHVar2;
        ppHVar4 = ppHVar4 + 1) {
      Heap::markFrom(heap,&(*ppHVar4)->super_HeapEntity);
    }
  }
  return;
}

Assistant:

void mark(Heap &heap)
    {
        for (const auto &f : stack) {
            f.mark(heap);
        }
    }